

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_solvers.h
# Opt level: O3

vector<Solver,_std::allocator<Solver>_> * GetAllSolvers(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<Solver,_std::allocator<Solver>_> *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Solver local_80;
  
  (in_RDI->super__Vector_base<Solver,_std::allocator<Solver>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<Solver,_std::allocator<Solver>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<Solver,_std::allocator<Solver>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"tdoku","");
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"T/shrc+./m+","");
  local_80.name_._M_string_length = local_98;
  local_80.desc_._M_string_length = local_b8;
  paVar1 = &local_80.name_.field_2;
  local_80.solve_ = TdokuSolverDpllTriadSimd;
  local_80.configuration_ = 0;
  if (local_a0 == &local_90) {
    local_80.name_.field_2._8_8_ = local_90._8_8_;
    local_80.name_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.name_._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.name_.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.name_.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  paVar2 = &local_80.desc_.field_2;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  if (local_c0 == &local_b0) {
    local_80.desc_.field_2._8_8_ = local_b0._8_8_;
    local_80.desc_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.desc_._M_dataplus._M_p = (pointer)local_c0;
  }
  local_80.desc_.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_80.desc_.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_80.returns_solution_ = true;
  local_80.returns_count_ = true;
  local_80.returns_full_count_ = true;
  local_80.returns_guess_count_ = true;
  local_c0 = &local_b0;
  local_a0 = &local_90;
  std::vector<Solver,_std::allocator<Solver>_>::emplace_back<Solver>(in_RDI,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.desc_._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.desc_._M_dataplus._M_p,local_80.desc_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.name_._M_dataplus._M_p,local_80.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  return in_RDI;
}

Assistant:

std::vector<Solver> GetAllSolvers() {
    std::vector<Solver> solvers;
    // @formatter:off

#ifdef GSS
    solvers.emplace_back(Solver(OtherSolverGss,               1, "gss1",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               2, "gss2",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               3, "gss3",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               4, "gss4",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               5, "gss5",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               6, "gss6",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               7, "gss7",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               8, "gss8",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               0, "gss",                       "           ", 15));
#endif
#ifdef GUROBI
    solvers.emplace_back(Solver(OtherSolverGurobi,            0, "gurobi",                    "I/sh..+./m+", 15));
#endif
#ifdef Z3
    solvers.emplace_back(Solver(OtherSolverZ3,                0, "z3",                        "I/sh..+./m+",  1));
#endif
#ifdef MINISAT
    solvers.emplace_back(Solver(OtherSolverMiniSat,           0, "minisat_minimal",           "S/s...+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           1, "minisat_natural",           "S/s...+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           2, "minisat_complete",          "S/sh..+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           3, "minisat_augmented",         "S/shrc+./m+", 15));
#endif
#ifdef TDEV
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      0, "_tdev_dpll_triad",          "S/shrc+./m.", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      1, "_tdev_dpll_triad_scc_i",    "S/shrc++/m.", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      2, "_tdev_dpll_triad_scc_h",    "S/shrc+./m+", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      3, "_tdev_dpll_triad_scc_ih",   "S/shrc++/m+", 15));
    solvers.emplace_back(Solver(TdokuSolverBasic,             0, "_tdev_basic",               "G/....../..", 15));
    solvers.emplace_back(Solver(TdokuSolverBasic,             1, "_tdev_basic_heuristic",     "G/s...../m.", 15));
#endif
#ifdef LHL
    solvers.emplace_back(Solver(OtherSolverLHLSudoku,         0, "lhl_sudoku",                "G/s...../m.", 14));
#endif
#ifdef ZERODOKU
    solvers.emplace_back(Solver(OtherSolverZeroDoku,          0, "zerodoku",                  "G/sh..../m.", 14));
#endif
#ifdef FAST_SOLV_9R2
    solvers.emplace_back(Solver(OtherSolverFastSolv9r2,       0, "fast_solv_9r2",             "E/sh..../m.", 14));
#endif
#ifdef KUDOKU
    solvers.emplace_back(Solver(OtherSolverKudoku,            0, "kudoku",                    "E/sh..../m.", 15));
#endif
#ifdef NORVIG
    solvers.emplace_back(Solver(OtherSolverNorvig,            0, "norvig",                    "C/sh..../m.", 15));
#endif
#ifdef BB_SUDOKU
    solvers.emplace_back(Solver(OtherSolverBBSudoku,          0, "bb_sudoku",                 "C/shrc../m.", 15));
#endif
#ifdef FSSS
    solvers.emplace_back(Solver(OtherSolverFsss,              0, "fsss",                      "C/shrc../m.", 11));
#endif
#ifdef JSOLVE
    solvers.emplace_back(Solver(OtherSolverJSolve,            0, "jsolve",                    "C/shrc../m.", 15));
#endif
#ifdef FSSS2
    solvers.emplace_back(Solver(OtherSolverFsss2,             0, "fsss2",                     "D/sh..../m.", 10));
    solvers.emplace_back(Solver(OtherSolverFsss2,             1, "fsss2_locked",              "D/shrc../m.", 10));
#endif
#ifdef JCZSOLVE
    solvers.emplace_back(Solver(OtherSolverJCZSolve,          0, "jczsolve",                  "B/shr.../m.", 15));
#endif
#ifdef SK_BFORCE2
    solvers.emplace_back(Solver(OtherSolverSKBFORCE2,         0, "sk_bforce2",                "B/shrc-./m+", 10));
#endif
#ifdef RUST_SUDOKU
    solvers.emplace_back(Solver(OtherSolverRustSudoku,        0, "rust_sudoku",               "B/shr.../m.", 14));
#endif
    solvers.emplace_back(Solver(TdokuSolverDpllTriadSimd,     0, "tdoku",                     "T/shrc+./m+", 15));
    // @formatter:on
    return solvers;
}